

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAM.c
# Opt level: O2

void debug_dump_VRAM(void)

{
  uint16_t address;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  FILE *__stream;
  uint32_t addr;
  uint uVar17;
  
  __stream = fopen("VRAM_dump.bin","w");
  if (__stream != (FILE *)0x0) {
    for (uVar17 = 0; uVar17 < 0x4000; uVar17 = uVar17 + 0x10) {
      address = (uint16_t)uVar17;
      bVar1 = read_VRAM(address);
      bVar2 = read_VRAM(address + 1);
      bVar3 = read_VRAM(address + 2);
      bVar4 = read_VRAM(address + 3);
      bVar5 = read_VRAM(address + 4);
      bVar6 = read_VRAM(address + 5);
      bVar7 = read_VRAM(address + 6);
      bVar8 = read_VRAM(address + 7);
      bVar9 = read_VRAM(address + 8);
      bVar10 = read_VRAM(address + 9);
      bVar11 = read_VRAM(address + 10);
      bVar12 = read_VRAM(address + 0xb);
      bVar13 = read_VRAM(address + 0xc);
      bVar14 = read_VRAM(address + 0xd);
      bVar15 = read_VRAM(address + 0xe);
      bVar16 = read_VRAM(address + 0xf);
      fprintf(__stream,
              "%04x: %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x\n"
              ,(ulong)uVar17,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,
              (ulong)bVar6,(ulong)bVar7,(ulong)bVar8,(ulong)bVar9,(ulong)bVar10,(ulong)bVar11,
              (ulong)bVar12,(ulong)bVar13,(ulong)bVar14,(ulong)bVar15,(ulong)bVar16);
    }
    fclose(__stream);
    return;
  }
  puts("ERROR: Could not open VRAM_dump.bin");
  exit(0);
}

Assistant:

void debug_dump_VRAM() {
    FILE* VRAM_dump = fopen("VRAM_dump.bin", "w");
    if(VRAM_dump == NULL) {
        printf("ERROR: Could not open VRAM_dump.bin\n");
        exit(0);
    }
    for(uint32_t addr = 0; addr < VRAM_SIZE; addr += 0x10) {
        fprintf(VRAM_dump, "%04x: %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x\n",
                addr, read_VRAM(addr), read_VRAM(addr + 0x1), read_VRAM(addr + 0x2), read_VRAM(addr + 0x3), read_VRAM(addr + 0x4),
                read_VRAM(addr + 0x5), read_VRAM(addr + 0x6), read_VRAM(addr + 0x7), read_VRAM(addr + 0x8), read_VRAM(addr + 0x9),
                read_VRAM(addr + 0xA), read_VRAM(addr + 0xB), read_VRAM(addr + 0xC), read_VRAM(addr + 0xD), read_VRAM(addr + 0xE),
                read_VRAM(addr + 0xF));
    }
    fclose(VRAM_dump);
}